

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_sequential_encoder.cc
# Opt level: O2

bool __thiscall draco::MeshSequentialEncoder::CompressAndEncodeIndices(MeshSequentialEncoder *this)

{
  int iVar1;
  Mesh *pMVar2;
  pointer paVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  int j;
  long lVar9;
  uint32_t encoded_val;
  MeshSequentialEncoder *local_60;
  ulong local_58;
  long local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> indices_buffer;
  
  indices_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  indices_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pMVar2 = (this->super_MeshEncoder).mesh_;
  local_58 = ((long)(pMVar2->faces_).vector_.
                    super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pMVar2->faces_).vector_.
                   super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff;
  lVar7 = 0;
  iVar4 = 0;
  local_60 = this;
  for (uVar8 = 0; uVar8 != local_58; uVar8 = uVar8 + 1) {
    paVar3 = (((local_60->super_MeshEncoder).mesh_)->faces_).vector_.
             super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_50 = lVar7;
    for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
      iVar1 = *(int *)((long)(paVar3->_M_elems + lVar9) + lVar7);
      uVar6 = iVar1 - iVar4;
      uVar5 = -uVar6;
      if (0 < (int)uVar6) {
        uVar5 = uVar6;
      }
      encoded_val = uVar5 << 1 | uVar6 >> 0x1f;
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                (&indices_buffer,&encoded_val);
      iVar4 = iVar1;
    }
    lVar7 = local_50 + 0xc;
  }
  EncodeSymbols(indices_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start,
                (int)((ulong)((long)indices_buffer.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)indices_buffer.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 2),1,(Options *)0x0,
                (local_60->super_MeshEncoder).super_PointCloudEncoder.buffer_);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&indices_buffer.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return true;
}

Assistant:

bool MeshSequentialEncoder::CompressAndEncodeIndices() {
  // Collect all indices to a buffer and encode them.
  // Each new index is a difference from the previous value.
  std::vector<uint32_t> indices_buffer;
  int32_t last_index_value = 0;
  const int num_faces = mesh()->num_faces();
  for (FaceIndex i(0); i < num_faces; ++i) {
    const auto &face = mesh()->face(i);
    for (int j = 0; j < 3; ++j) {
      const int32_t index_value = face[j].value();
      const int32_t index_diff = index_value - last_index_value;
      // Encode signed value to an unsigned one (put the sign to lsb pos).
      const uint32_t encoded_val =
          (abs(index_diff) << 1) | (index_diff < 0 ? 1 : 0);
      indices_buffer.push_back(encoded_val);
      last_index_value = index_value;
    }
  }
  EncodeSymbols(indices_buffer.data(), static_cast<int>(indices_buffer.size()),
                1, nullptr, buffer());
  return true;
}